

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O1

void __thiscall soplex::SVectorBase<double>::sort(SVectorBase<double> *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Nonzero<double> *pNVar4;
  long lVar5;
  Nonzero<double> *s;
  long lVar6;
  Nonzero<double> *pNVar7;
  Nonzero<double> *pNVar8;
  long lVar9;
  Nonzero<double> *pNVar10;
  
  pNVar4 = this->m_elem;
  if ((pNVar4 != (Nonzero<double> *)0x0) && (iVar2 = this->memused, 1 < (long)iVar2)) {
    lVar6 = 0x10;
    pNVar10 = pNVar4 + 1;
    pNVar8 = pNVar4;
    do {
      pNVar7 = pNVar10;
      if (pNVar8[1].idx < pNVar8->idx) {
        dVar1 = pNVar8[1].val;
        iVar3 = pNVar8[1].idx;
        lVar5 = lVar6;
        do {
          lVar9 = lVar5;
          *(undefined4 *)((long)&pNVar4->idx + lVar9) = *(undefined4 *)((long)pNVar4 + lVar9 + -8);
          *(undefined8 *)((long)&pNVar4->val + lVar9) =
               *(undefined8 *)((long)&pNVar4[-1].val + lVar9);
          pNVar10 = pNVar4;
          if (lVar9 == 0x10) goto LAB_00207a9a;
          lVar5 = lVar9 + -0x10;
        } while (iVar3 < *(int *)((long)pNVar4 + lVar9 + -0x18));
        pNVar10 = (Nonzero<double> *)((long)&pNVar4[-1].val + lVar9);
LAB_00207a9a:
        pNVar10->val = dVar1;
        pNVar10->idx = iVar3;
      }
      pNVar10 = pNVar7 + 1;
      lVar6 = lVar6 + 0x10;
      pNVar8 = pNVar7;
    } while (pNVar10 < pNVar4 + iVar2);
  }
  return;
}

Assistant:

void sort()
   {
      if(m_elem != nullptr)
      {
         Nonzero<R> dummy;
         Nonzero<R>* w;
         Nonzero<R>* l;
         Nonzero<R>* s = &(m_elem[0]);
         Nonzero<R>* e = s + size();

         for(l = s, w = s + 1; w < e; l = w, ++w)
         {
            if(l->idx > w->idx)
            {
               dummy = *w;

               do
               {
                  l[1] = *l;

                  if(l-- == s)
                     break;
               }
               while(l->idx > dummy.idx);

               l[1] = dummy;
            }
         }
      }
   }